

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void interactiveMode(void)

{
  string *psVar1;
  _Map_pointer *pppbVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  Script *this;
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pdVar4;
  pointer *__return_storage_ptr__;
  bool bVar5;
  element_type *peVar6;
  pointer pBVar7;
  undefined1 auVar8 [8];
  _Alloc_hider _Var9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  StepRunResult SVar13;
  undefined4 extraout_var;
  char *pcVar14;
  size_t sVar15;
  undefined8 uVar16;
  size_t sVar17;
  IllegalArgumentException *pIVar18;
  size_type sVar19;
  reference pbVar20;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  ThreadId TVar21;
  undefined8 *puVar22;
  size_t i;
  ulong uVar23;
  long lVar24;
  byte *pbVar25;
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_00;
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_01;
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_02;
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_03;
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_04;
  undefined8 uVar26;
  uint __val;
  long lVar27;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar29;
  pointer pcVar30;
  string *psVar31;
  long lVar32;
  uint uVar33;
  pointer pPVar34;
  __normal_iterator<const_chatra::debugger::PackageState_*,_std::vector<chatra::debugger::PackageState,_std::allocator<chatra::debugger::PackageState>_>_>
  _Var35;
  const_iterator __position;
  bool bVar36;
  initializer_list<chatra::Script> __l;
  initializer_list<chatra::Script> __l_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  string local_308;
  undefined1 local_2e8 [8];
  value_type cmd;
  string local_2a8;
  undefined1 local_288 [8];
  tuple<Target,_unsigned_long> e;
  IErrorReceiverBridge errorReceiver;
  INullErrorReceiver nullErrorReceiver;
  string lines;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> input;
  vector<std::shared_ptr<chatra::Line>,_std::allocator<std::shared_ptr<chatra::Line>_>_> lines_1;
  shared_ptr<chatra::StringTable> sTable;
  undefined1 local_1d0 [8];
  vector<chatra::Script,_std::allocator<chatra::Script>_> scripts;
  vector<chatra::debugger::PackageState,_std::allocator<chatra::debugger::PackageState>_> packages;
  size_type *local_198;
  string line;
  string subLine;
  string fileName;
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> verb;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  uint local_a8;
  ulong local_98;
  undefined1 local_90 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> vScript;
  undefined1 local_60 [8];
  string vName;
  byte local_31 [8];
  bool hasPackageName;
  
  signal(2,signalHandler);
  rl_bind_key(9,rl_insert);
  stifle_history(1000);
  iVar11 = (*(runtime.super___shared_ptr<chatra::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             _vptr_Runtime[10])();
  interactiveInstanceId = CONCAT44(extraout_var,iVar11);
  dLog(0,"Chatra interactive frontend");
  dLog(0,"type \"!h\" to show debugger command help");
  nullErrorReceiver.super_IErrorReceiver._vptr_IErrorReceiver =
       (IErrorReceiver)&lines._M_string_length;
  lines._M_dataplus._M_p = (pointer)0x0;
  lines._M_string_length._0_1_ = 0;
  local_198 = &line._M_string_length;
  line._M_dataplus._M_p = (pointer)0x0;
  line._M_string_length._0_1_ = 0;
  uVar33 = 1;
  bVar5 = false;
  bVar36 = false;
  local_98 = 0;
  do {
    if ((prompt(bool,bool,unsigned_int,unsigned_int)::ret_abi_cxx11_ == '\0') &&
       (iVar11 = __cxa_guard_acquire(&prompt(bool,bool,unsigned_int,unsigned_int)::ret_abi_cxx11_),
       iVar11 != 0)) {
      prompt(bool,bool,unsigned_int,unsigned_int)::ret_abi_cxx11_ = &DAT_002426e0;
      _DAT_002426d8 = 0;
      DAT_002426e0 = 0;
      __cxa_atexit(std::__cxx11::string::~string,
                   &prompt(bool,bool,unsigned_int,unsigned_int)::ret_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&prompt(bool,bool,unsigned_int,unsigned_int)::ret_abi_cxx11_);
    }
    __val = (uint)local_98;
    if (optEnableColor == '\0') {
      if (bVar36) {
        std::__cxx11::to_string((string *)local_60,uVar33);
        pppbVar2 = &args.
                    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_node;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pppbVar2
                       ,"\x01\x1b[0m\x02:",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60
                      );
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&fileName.field_2 + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pppbVar2
                       ,">>\x01\x1b[0m\x02 ");
        goto LAB_00110fbc;
      }
      if (bVar5) {
        std::__cxx11::to_string((string *)((long)&subLine.field_2 + 8),__val);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90
                       ,"\x01\x1b[0m\x02chatra[",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&subLine.field_2 + 8));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_90,"]:");
        p_Var3 = &sTable.super___shared_ptr<chatra::StringTable,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount;
        std::__cxx11::to_string((string *)p_Var3,uVar33);
        pppbVar2 = &args.
                    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_node;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pppbVar2
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_60,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)p_Var3);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&fileName.field_2 + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pppbVar2
                       ,">\x01\x1b[0m\x02 ");
      }
      else {
        std::__cxx11::to_string((string *)((long)&subLine.field_2 + 8),__val);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90
                       ,"\x01\x1b[0m\x1b[7m\x02chatra[",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&subLine.field_2 + 8));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_90,"]:");
        p_Var3 = &sTable.super___shared_ptr<chatra::StringTable,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount;
        std::__cxx11::to_string((string *)p_Var3,uVar33);
        pppbVar2 = &args.
                    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_node;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pppbVar2
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_60,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)p_Var3);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&fileName.field_2 + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pppbVar2
                       ,">\x01\x1b[0m\x02 ");
      }
LAB_00111184:
      std::__cxx11::string::operator=
                ((string *)&prompt(bool,bool,unsigned_int,unsigned_int)::ret_abi_cxx11_,
                 (string *)(fileName.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(fileName.field_2._M_local_buf + 8));
      std::__cxx11::string::~string
                ((string *)
                 &args.
                  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_node);
      std::__cxx11::string::~string
                ((string *)
                 &sTable.super___shared_ptr<chatra::StringTable,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__cxx11::string::~string((string *)local_60);
      std::__cxx11::string::~string((string *)local_90);
      psVar31 = (string *)(subLine.field_2._M_local_buf + 8);
    }
    else {
      if (!bVar36) {
        std::__cxx11::to_string((string *)((long)&subLine.field_2 + 8),__val);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90
                       ,"chatra[",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&subLine.field_2 + 8));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_90,"]:");
        p_Var3 = &sTable.super___shared_ptr<chatra::StringTable,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount;
        std::__cxx11::to_string((string *)p_Var3,uVar33);
        pppbVar2 = &args.
                    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_node;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pppbVar2
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_60,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)p_Var3);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&fileName.field_2 + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pppbVar2
                       ,"> ");
        goto LAB_00111184;
      }
      std::__cxx11::to_string((string *)local_60,uVar33);
      pppbVar2 = &args.
                  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_node;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pppbVar2,
                     ":",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_60);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&fileName.field_2 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pppbVar2,
                     ">> ");
LAB_00110fbc:
      std::__cxx11::string::operator=
                ((string *)&prompt(bool,bool,unsigned_int,unsigned_int)::ret_abi_cxx11_,
                 (string *)(fileName.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(fileName.field_2._M_local_buf + 8));
      std::__cxx11::string::~string
                ((string *)
                 &args.
                  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_node);
      psVar31 = (string *)local_60;
    }
    std::__cxx11::string::~string(psVar31);
    pcVar14 = (char *)readline(prompt(bool,bool,unsigned_int,unsigned_int)::ret_abi_cxx11_);
    sVar15 = strlen(pcVar14);
    iVar11 = 0;
    for (uVar23 = 0; uVar23 < sVar15; uVar23 = uVar23 + 1) {
      if (pcVar14[uVar23] == '\t') {
        iVar11 = iVar11 + 1;
      }
      else if (((pcVar14[uVar23] == ' ' && uVar23 + 3 < sVar15) && (pcVar14[uVar23 + 1] == ' ')) &&
              (pcVar14[uVar23 + 2] == ' ')) {
        lVar24 = uVar23 + 3;
        uVar10 = uVar23 + 3;
        if (pcVar14[lVar24] != ' ') {
          uVar10 = uVar23;
        }
        uVar23 = uVar10;
        iVar11 = iVar11 + (uint)(pcVar14[lVar24] == ' ');
      }
    }
    line.field_2._8_8_ = &subLine._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)((long)&line.field_2 + 8),pcVar14,pcVar14 + sVar15);
    if (bVar36) {
      iVar11 = iVar11 + 2;
      while (bVar36 = iVar11 != 0, iVar11 = iVar11 + -1, bVar36) {
        std::__cxx11::string::insert((undefined1 *)((long)&line.field_2 + 8),line.field_2._8_8_,9);
      }
    }
    uVar33 = uVar33 + 1;
    lVar32 = 0;
    lVar27 = 0;
    for (lVar24 = (long)subLine._M_dataplus._M_p >> 2; 0 < lVar24; lVar24 = lVar24 + -1) {
      uVar23 = (ulong)*(byte *)(line.field_2._8_8_ + lVar32 * 4);
      if ((0x20 < uVar23) || ((0x100000600U >> (uVar23 & 0x3f) & 1) == 0)) {
        pbVar25 = (byte *)(line.field_2._8_8_ - lVar27);
        goto LAB_001113e0;
      }
      uVar23 = (ulong)*(byte *)(line.field_2._8_8_ + 1 + lVar32 * 4);
      if ((0x20 < uVar23) || ((0x100000600U >> (uVar23 & 0x3f) & 1) == 0)) {
        pbVar25 = (byte *)((line.field_2._8_8_ - lVar27) + 1);
        goto LAB_001113e0;
      }
      uVar23 = (ulong)*(byte *)(line.field_2._8_8_ + 2 + lVar32 * 4);
      if ((0x20 < uVar23) || ((0x100000600U >> (uVar23 & 0x3f) & 1) == 0)) {
        pbVar25 = (byte *)((line.field_2._8_8_ - lVar27) + 2);
        goto LAB_001113e0;
      }
      uVar23 = (ulong)*(byte *)(line.field_2._8_8_ + 3 + lVar32 * 4);
      if ((0x20 < uVar23) || ((0x100000600U >> (uVar23 & 0x3f) & 1) == 0)) {
        pbVar25 = (byte *)((line.field_2._8_8_ - lVar27) + 3);
        goto LAB_001113e0;
      }
      lVar27 = lVar27 + -4;
      lVar32 = lVar32 + 1;
    }
    pbVar25 = (byte *)(line.field_2._8_8_ - lVar27);
    pcVar30 = subLine._M_dataplus._M_p + lVar27;
    if (pcVar30 == (pointer)0x1) {
LAB_0011139c:
      if ((0x20 < (ulong)*pbVar25) || ((0x100000600U >> ((ulong)*pbVar25 & 0x3f) & 1) == 0))
      goto LAB_001113e0;
    }
    else {
      if (pcVar30 == (pointer)0x2) {
LAB_00111380:
        if (((ulong)*pbVar25 < 0x21) && ((0x100000600U >> ((ulong)*pbVar25 & 0x3f) & 1) != 0)) {
          pbVar25 = pbVar25 + 1;
          goto LAB_0011139c;
        }
      }
      else {
        if (pcVar30 != (pointer)0x3) goto LAB_001113f1;
        uVar23 = (ulong)*(byte *)(line.field_2._8_8_ + lVar32 * 4);
        if ((uVar23 < 0x21) && ((0x100000600U >> (uVar23 & 0x3f) & 1) != 0)) {
          pbVar25 = (byte *)((line.field_2._8_8_ - lVar27) + 1);
          goto LAB_00111380;
        }
      }
LAB_001113e0:
      if ((byte *)(subLine._M_dataplus._M_p + line.field_2._8_8_) != pbVar25) {
        add_history();
      }
    }
LAB_001113f1:
    if ((subLine._M_dataplus._M_p == (pointer)0x0) ||
       (subLine._M_dataplus._M_p[line.field_2._8_8_ + -1] != '\n')) {
      std::__cxx11::string::push_back((char)&line.field_2 + '\b');
    }
    if ((subLine._M_dataplus._M_p < (pointer)0x2) ||
       (subLine._M_dataplus._M_p[line.field_2._8_8_ + -2] != '\\')) {
      std::__cxx11::string::append((string *)&local_198);
      while (uVar23 = std::__cxx11::string::find((char *)&local_198,0x1b3501),
            uVar23 != 0xffffffffffffffff) {
        std::__cxx11::string::erase((ulong)&local_198,uVar23);
      }
      std::__cxx11::string::append((string *)&nullErrorReceiver);
      if (bVar5) {
        if ((pointer)0x1 < line._M_dataplus._M_p) {
LAB_0011165d:
          line._M_dataplus._M_p = (pointer)0x0;
          *(undefined1 *)local_198 = 0;
          bVar5 = true;
          bVar36 = false;
          goto LAB_00111d05;
        }
      }
      else {
        _Var28 = std::
                 __find_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<bool(*)(char)>>
                           (local_198,line._M_dataplus._M_p + (long)local_198,chatra::isNotSpace);
        fileName.field_2._8_8_ =
             &args.
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Deque_impl_data._M_map_size;
        psVar1 = (string *)(fileName.field_2._M_local_buf + 8);
        std::__cxx11::string::
        _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  ((string *)psVar1,_Var28._M_current,(long)local_198 + line._M_dataplus._M_p);
        bVar36 = isBlockStatement(psVar1);
        std::__cxx11::string::~string((string *)psVar1);
        if (bVar36) goto LAB_0011165d;
      }
      line._M_dataplus._M_p = (pointer)0x0;
      *(undefined1 *)local_198 = 0;
      std::
      __find_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<bool(*)(char)>>
                (nullErrorReceiver.super_IErrorReceiver._vptr_IErrorReceiver,
                 lines._M_dataplus._M_p +
                 (long)nullErrorReceiver.super_IErrorReceiver._vptr_IErrorReceiver,
                 chatra::isNotSpace);
      std::__cxx11::string::substr((ulong)((long)&lines.field_2 + 8),(ulong)&nullErrorReceiver);
      lines._M_dataplus._M_p = (pointer)0x0;
      *(undefined1 *)nullErrorReceiver.super_IErrorReceiver._vptr_IErrorReceiver = 0;
      lVar32 = 0;
      lVar27 = 0;
      for (lVar24 = (long)input._M_dataplus._M_p >> 2; 0 < lVar24; lVar24 = lVar24 + -1) {
        uVar23 = (ulong)*(byte *)(lines.field_2._8_8_ + lVar32 * 4);
        if ((0x20 < uVar23) || ((0x100000600U >> (uVar23 & 0x3f) & 1) == 0)) {
          pbVar25 = (byte *)(lines.field_2._8_8_ - lVar27);
          goto LAB_001116d0;
        }
        uVar23 = (ulong)*(byte *)(lines.field_2._8_8_ + 1 + lVar32 * 4);
        if ((0x20 < uVar23) || ((0x100000600U >> (uVar23 & 0x3f) & 1) == 0)) {
          pbVar25 = (byte *)((lines.field_2._8_8_ - lVar27) + 1);
          goto LAB_001116d0;
        }
        uVar23 = (ulong)*(byte *)(lines.field_2._8_8_ + 2 + lVar32 * 4);
        if ((0x20 < uVar23) || ((0x100000600U >> (uVar23 & 0x3f) & 1) == 0)) {
          pbVar25 = (byte *)((lines.field_2._8_8_ - lVar27) + 2);
          goto LAB_001116d0;
        }
        uVar23 = (ulong)*(byte *)(lines.field_2._8_8_ + 3 + lVar32 * 4);
        if ((0x20 < uVar23) || ((0x100000600U >> (uVar23 & 0x3f) & 1) == 0)) {
          pbVar25 = (byte *)((lines.field_2._8_8_ - lVar27) + 3);
          goto LAB_001116d0;
        }
        lVar27 = lVar27 + -4;
        lVar32 = lVar32 + 1;
      }
      pbVar25 = (byte *)(lines.field_2._8_8_ - lVar27);
      pcVar30 = input._M_dataplus._M_p + lVar27;
      if (pcVar30 == (pointer)0x1) {
LAB_00111893:
        if ((0x20 < (ulong)*pbVar25) || ((0x100000600U >> ((ulong)*pbVar25 & 0x3f) & 1) == 0))
        goto LAB_001116d0;
      }
      else {
        if (pcVar30 == (pointer)0x3) {
          uVar23 = (ulong)*(byte *)(lines.field_2._8_8_ + lVar32 * 4);
          if ((uVar23 < 0x21) && ((0x100000600U >> (uVar23 & 0x3f) & 1) != 0)) {
            pbVar25 = (byte *)((lines.field_2._8_8_ - lVar27) + 1);
            goto LAB_0011186f;
          }
        }
        else {
          if (pcVar30 != (pointer)0x2) goto LAB_00111cec;
LAB_0011186f:
          if (((ulong)*pbVar25 < 0x21) && ((0x100000600U >> ((ulong)*pbVar25 & 0x3f) & 1) != 0)) {
            pbVar25 = pbVar25 + 1;
            goto LAB_00111893;
          }
        }
LAB_001116d0:
        if ((byte *)(input._M_dataplus._M_p + lines.field_2._8_8_) != pbVar25) {
          if (*(char *)lines.field_2._8_8_ == '!') {
            chatra::StringTable::newInstance();
            errorReceiver._16_8_ = &PTR__IErrorReceiver_0023d1e8;
            e.super__Tuple_impl<0UL,_Target,_unsigned_long>._8_8_ = &PTR__IErrorReceiver_0023d238;
            errorReceiver.super_IErrorReceiver._vptr_IErrorReceiver =
                 (_func_int **)&errorReceiver.errorCount;
            errorReceiver.target._0_4_ = 0;
            std::__cxx11::string::string
                      ((string *)(fileName.field_2._M_local_buf + 8),"(debugger-command)",
                       (allocator *)
                       &args.
                        super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_node);
            p_Var3 = &sTable.super___shared_ptr<chatra::StringTable,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount;
            std::__cxx11::string::string
                      ((string *)p_Var3,(string *)(lines.field_2._M_local_buf + 8));
            chatra::parseLines((vector<std::shared_ptr<chatra::Line>,_std::allocator<std::shared_ptr<chatra::Line>_>_>
                                *)((long)&input.field_2 + 8),
                               (IErrorReceiver *)
                               &e.super__Tuple_impl<0UL,_Target,_unsigned_long>.
                                super__Head_base<0UL,_Target,_false>,
                               (shared_ptr<chatra::StringTable> *)
                               &lines_1.
                                super__Vector_base<std::shared_ptr<chatra::Line>,_std::allocator<std::shared_ptr<chatra::Line>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (string *)(fileName.field_2._M_local_buf + 8),1,(string *)p_Var3);
            std::__cxx11::string::~string((string *)p_Var3);
            std::__cxx11::string::~string((string *)(fileName.field_2._M_local_buf + 8));
            if (((((int)errorReceiver.target == 0) &&
                 ((pointer)input.field_2._8_8_ !=
                  lines_1.
                  super__Vector_base<std::shared_ptr<chatra::Line>,_std::allocator<std::shared_ptr<chatra::Line>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)) &&
                (lVar24 = *(long *)(*(long *)input.field_2._8_8_ + 0x58),
                1 < (ulong)((*(long *)(*(long *)input.field_2._8_8_ + 0x60) - lVar24) / 0x50))) &&
               (*(int *)(lVar24 + 0x78) == 1)) {
              std::
              _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::_Deque_base((_Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)((long)&fileName.field_2 + 8));
              vName.field_2._8_8_ =
                   lines_1.
                   super__Vector_base<std::shared_ptr<chatra::Line>,_std::allocator<std::shared_ptr<chatra::Line>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              for (uVar16 = input.field_2._8_8_; uVar16 != vName.field_2._8_8_;
                  uVar16 = uVar16 + 0x10) {
                lVar27 = *(long *)(*(long *)uVar16 + 0x60);
                for (lVar24 = *(long *)(*(long *)uVar16 + 0x58); lVar24 != lVar27;
                    lVar24 = lVar24 + 0x50) {
                  if (*(int *)(lVar24 + 0x28) == 2) {
                    if ((**(char **)(lVar24 + 0x30) != '\"') && (**(char **)(lVar24 + 0x30) != '\'')
                       ) {
                      pIVar18 = (IllegalArgumentException *)__cxa_allocate_exception(0x28);
                      chatra::IllegalArgumentException::IllegalArgumentException
                                (pIVar18,
                                 "string quotation pattern used with specified parameter is not supported"
                                );
                      __cxa_throw(pIVar18,&chatra::IllegalArgumentException::typeinfo,
                                  chatra::NativeException::~NativeException);
                    }
                    args.
                    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_node =
                         (_Map_pointer)&verb._M_string_length;
                    verb._M_dataplus._M_p = (pointer)0x0;
                    psVar1 = (string *)(lVar24 + 0x30);
                    verb._M_string_length._0_1_ = 0;
                    uVar23 = 1;
                    while (uVar23 < *(ulong *)(lVar24 + 0x38)) {
                      pcVar30 = (psVar1->_M_dataplus)._M_p;
                      if (pcVar30[uVar23] == '\\') {
                        uVar33 = (byte)pcVar30[uVar23 + 1] - 0x22;
                        if ((0x3a < uVar33) ||
                           ((0x400000000000021U >> ((ulong)uVar33 & 0x3f) & 1) == 0)) {
                          pIVar18 = (IllegalArgumentException *)__cxa_allocate_exception(0x28);
                          chatra::IllegalArgumentException::IllegalArgumentException
                                    (pIVar18,"unknown escape sequence");
                          __cxa_throw(pIVar18,&chatra::IllegalArgumentException::typeinfo,
                                      chatra::NativeException::~NativeException);
                        }
                        uVar23 = uVar23 + 2;
                        std::__cxx11::string::append
                                  ((ulong)&args.
                                           super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Deque_impl_data._M_finish._M_node,'\x01')
                        ;
                      }
                      else {
                        sVar17 = chatra::byteCount(psVar1,uVar23);
                        _Var28._M_current = (psVar1->_M_dataplus)._M_p + uVar23;
                        std::__cxx11::string::
                        append<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
                                  ((string *)
                                   &args.
                                    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Deque_impl_data._M_finish._M_node,_Var28,
                                   (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    )(_Var28._M_current + sVar17));
                        uVar23 = uVar23 + sVar17;
                      }
                    }
                    std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    emplace_back<std::__cxx11::string>
                              ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                               (fileName.field_2._M_local_buf + 8),
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &args.
                                super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Deque_impl_data._M_finish._M_node);
LAB_00111a55:
                    std::__cxx11::string::~string
                              ((string *)
                               &args.
                                super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Deque_impl_data._M_finish._M_node);
                  }
                  else {
                    if (*(int *)(lVar24 + 0x28) != 0) {
                      pppbVar2 = &args.
                                  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Deque_impl_data._M_finish._M_node;
                      chatra::StringTable::ref_abi_cxx11_
                                ((string *)pppbVar2,
                                 (StringTable *)
                                 lines_1.
                                 super__Vector_base<std::shared_ptr<chatra::Line>,_std::allocator<std::shared_ptr<chatra::Line>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                 *(StringId *)(lVar24 + 0x2c));
                      std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                      emplace_back<std::__cxx11::string>
                                ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *
                                 )(fileName.field_2._M_local_buf + 8),
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)pppbVar2);
                      goto LAB_00111a55;
                    }
                    std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    emplace_back<std::__cxx11::string&>
                              ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                               (fileName.field_2._M_local_buf + 8),
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               (lVar24 + 0x30));
                  }
                }
              }
              pdVar4 = (deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)(&fileName.field_2._M_allocated_capacity + 1);
              std::
              deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::pop_front(pdVar4);
              std::__cxx11::string::string
                        ((string *)local_2e8,
                         (string *)
                         args.
                         super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Deque_impl_data._M_map_size);
              std::
              deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::pop_front(pdVar4);
              bVar36 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_2e8,"h");
              if ((bVar36) ||
                 (bVar36 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)local_2e8,"help"), bVar36)) {
                dLog(0,"debugger command:");
                for (lVar24 = 0x10; lVar24 != 400; lVar24 = lVar24 + 0x18) {
                  dLogC(1,"^!$%s %s",
                        *(undefined8 *)((long)&PTR_anon_var_dwarf_22e0c_0023cf20 + lVar24));
                  dLog(2,"%s",*(undefined8 *)((long)&PTR_anon_var_dwarf_230cf_0023cf30 + lVar24));
                }
              }
              else {
                bVar36 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_2e8,"run");
                if (bVar36) {
                  local_60 = (undefined1  [8])&vName._M_string_length;
                  vName._M_dataplus._M_p = (pointer)0x0;
                  vName._M_string_length = vName._M_string_length & 0xffffffffffffff00;
                  sVar19 = std::
                           deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::size((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)((long)&fileName.field_2 + 8));
                  if (1 < sVar19) {
                    pbVar20 = std::
                              _Deque_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                              ::operator[]((_Deque_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                                            *)&args.
                                               super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Deque_impl_data._M_map_size,1);
                    bVar36 = std::operator==(pbVar20,":");
                    if (bVar36) {
                      std::__cxx11::string::_M_assign((string *)local_60);
                      std::
                      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::pop_front(pdVar4);
                      std::
                      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::pop_front(pdVar4);
                    }
                  }
                  consume<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_90,(string *)local_2e8,
                             (deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)((long)&fileName.field_2 + 8));
                  pbVar29 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_60;
                  if (vName._M_dataplus._M_p == (pointer)0x0) {
                    pbVar29 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_90;
                  }
                  std::__cxx11::string::string
                            ((string *)(subLine.field_2._M_local_buf + 8),(string *)pbVar29);
                  __return_storage_ptr__ =
                       &scripts.super__Vector_base<chatra::Script,_std::allocator<chatra::Script>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage;
                  loadScript_abi_cxx11_((string *)__return_storage_ptr__,(char *)local_90);
                  pppbVar2 = &args.
                              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_node;
                  chatra::Script::Script
                            ((Script *)pppbVar2,(string *)(subLine.field_2._M_local_buf + 8),
                             (string *)__return_storage_ptr__);
                  __l_00._M_len = 1;
                  __l_00._M_array = (iterator)pppbVar2;
                  std::vector<chatra::Script,_std::allocator<chatra::Script>_>::vector
                            ((vector<chatra::Script,_std::allocator<chatra::Script>_> *)local_1d0,
                             __l_00,(allocator_type *)(vScript.field_2._M_local_buf + 0xc));
                  chatra::Script::~Script((Script *)pppbVar2);
                  std::__cxx11::string::~string((string *)__return_storage_ptr__);
                  std::__cxx11::string::~string((string *)(subLine.field_2._M_local_buf + 8));
                  peVar6 = host.super___shared_ptr<Host,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                  std::__cxx11::string::string
                            ((string *)pppbVar2,"",(allocator *)(vScript.field_2._M_local_buf + 0xc)
                            );
                  Host::push(peVar6,(string *)pppbVar2,
                             (vector<chatra::Script,_std::allocator<chatra::Script>_> *)local_1d0);
                  std::__cxx11::string::~string((string *)pppbVar2);
                  iVar11 = (*(runtime.
                              super___shared_ptr<chatra::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                             )->_vptr_Runtime[7])
                                     (runtime.
                                      super___shared_ptr<chatra::Runtime,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr,(vector<chatra::Script,_std::allocator<chatra::Script>_>
                                               *)local_1d0);
                  iVar12 = (*(runtime.
                              super___shared_ptr<chatra::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                             )->_vptr_Runtime[9])
                                     (runtime.
                                      super___shared_ptr<chatra::Runtime,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr,CONCAT44(extraout_var_00,iVar11));
                  _Var9 = vName._M_dataplus;
                  pcVar14 = "~file:$";
                  if (vName._M_dataplus._M_p != (pointer)0x0) {
                    std::operator+(&local_328,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_60,":");
                    escape((string *)((long)&cmd.field_2 + 8),&local_328);
                    pcVar14 = (char *)cmd.field_2._8_8_;
                  }
                  escape((string *)
                         &args.
                          super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_node,(string *)local_90);
                  dLogC(0,"\\[<I%zu>\\] <P%zu> %s %s",CONCAT44(extraout_var_01,iVar12),
                        CONCAT44(extraout_var_00,iVar11),pcVar14,
                        args.
                        super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_node);
                  std::__cxx11::string::~string
                            ((string *)
                             &args.
                              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_node);
                  if (_Var9._M_p != (pointer)0x0) {
                    std::__cxx11::string::~string((string *)(cmd.field_2._M_local_buf + 8));
                    std::__cxx11::string::~string((string *)&local_328);
                  }
                  std::vector<chatra::Script,_std::allocator<chatra::Script>_>::~vector
                            ((vector<chatra::Script,_std::allocator<chatra::Script>_> *)local_1d0);
                  std::__cxx11::string::~string((string *)local_90);
                  psVar31 = (string *)local_60;
LAB_00111ff1:
                  std::__cxx11::string::~string(psVar31);
                }
                else {
                  bVar36 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)local_2e8,"resume");
                  if (bVar36) {
                    LOCK();
                    interruptionState._M_i = Acceptable;
                    UNLOCK();
                    runUntilBreak();
LAB_0011201c:
                    LOCK();
                    interruptionState._M_i = Masked;
                    UNLOCK();
                  }
                  else {
                    bVar36 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)local_2e8,"l");
                    if ((((bVar36) ||
                         (bVar36 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_2e8,"ls"), bVar36)) ||
                        (bVar36 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_2e8,"list"), bVar36)) ||
                       ((bVar36 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_2e8,"s"), bVar36 ||
                        (bVar36 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_2e8,"show"), bVar36)))) {
                      if (args.
                          super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_node ==
                          (_Map_pointer)
                          args.
                          super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Deque_impl_data._M_map_size) {
                        dLog(0,"package  instance  thread  frame  scope  object  breakpoint");
                      }
                      else {
                        std::
                        _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::_Deque_base((_Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)&args.
                                          super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Deque_impl_data._M_finish._M_node,
                                      (_Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)((long)&fileName.field_2 + 8));
                        show((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&args.
                                 super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Deque_impl_data._M_finish._M_node);
LAB_001120ba:
                        std::
                        deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&args.
                                     super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Deque_impl_data._M_finish._M_node);
                      }
                    }
                    else {
                      bVar36 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)local_2e8,"b");
                      if (((bVar36) ||
                          (bVar36 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_2e8,"break"), bVar36)) ||
                         (bVar36 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_2e8,"breakpoint"), bVar36)) {
                        pdVar4 = (deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)(&fileName.field_2._M_allocated_capacity + 1);
                        if ((args.
                             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_node ==
                             (_Map_pointer)
                             args.
                             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Deque_impl_data._M_map_size) ||
                           (bVar36 = std::operator!=((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)args.
                                                  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Deque_impl_data._M_map_size,"@"),
                           bVar36)) {
                          puVar22 = (undefined8 *)__cxa_allocate_exception(0x28);
                          puVar22[4] = 0;
                          puVar22[2] = 0;
                          puVar22[3] = 0;
                          puVar22[1] = puVar22 + 3;
                          *puVar22 = &PTR__NativeException_0023ce78;
                          __cxa_throw(puVar22,&chatra::IllegalArgumentException::typeinfo,
                                      chatra::NativeException::~NativeException);
                        }
                        std::
                        deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::pop_front(pdVar4);
                        local_90 = (undefined1  [8])&vScript._M_string_length;
                        vScript._M_dataplus._M_p = (pointer)0x0;
                        vScript._M_string_length._0_1_ = 0;
                        if (args.
                            super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_node ==
                            (_Map_pointer)
                            args.
                            super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Deque_impl_data._M_map_size) {
LAB_001121bb:
                          sVar19 = std::
                                   deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ::size(pdVar4);
                          if (1 < sVar19) {
                            pbVar20 = std::
                                      _Deque_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                                      ::operator[]((
                                                  _Deque_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                                                  *)&args.
                                                  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Deque_impl_data._M_map_size,1);
                            bVar36 = std::operator==(pbVar20,":");
                            if (bVar36) {
                              local_31[0] = 1;
                              std::
                              _Deque_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                              ::operator[]((_Deque_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                                            *)&args.
                                               super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Deque_impl_data._M_map_size,0);
                              std::__cxx11::string::_M_assign((string *)local_90);
                              std::
                              deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::pop_front(pdVar4);
                              std::
                              deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::pop_front(pdVar4);
                            }
                          }
                        }
                        else {
                          pbVar20 = std::
                                    _Deque_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                                    ::operator[]((_Deque_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                                                  *)&args.
                                                  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Deque_impl_data._M_map_size,0);
                          bVar36 = std::operator==(pbVar20,":");
                          if (!bVar36) goto LAB_001121bb;
                          local_31[0] = 1;
                        }
                        sVar19 = std::
                                 deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ::size(pdVar4);
                        if (sVar19 < 4) {
LAB_00112cfb:
                          puVar22 = (undefined8 *)__cxa_allocate_exception(0x28);
                          puVar22[4] = 0;
                          puVar22[2] = 0;
                          puVar22[3] = 0;
                          puVar22[1] = puVar22 + 3;
                          *puVar22 = &PTR__NativeException_0023ce78;
                          __cxa_throw(puVar22,&chatra::IllegalArgumentException::typeinfo,
                                      chatra::NativeException::~NativeException);
                        }
                        pbVar20 = std::
                                  _Deque_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                                  ::operator[]((_Deque_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                                                *)&args.
                                                  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Deque_impl_data._M_map_size,1);
                        bVar36 = std::operator!=(pbVar20,"(");
                        if (bVar36) goto LAB_00112cfb;
                        pbVar20 = std::
                                  _Deque_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                                  ::operator[]((_Deque_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                                                *)&args.
                                                  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Deque_impl_data._M_map_size,3);
                        bVar36 = std::operator!=(pbVar20,")");
                        if (bVar36) goto LAB_00112cfb;
                        pbVar20 = std::
                                  _Deque_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                                  ::operator[]((_Deque_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                                                *)&args.
                                                  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Deque_impl_data._M_map_size,0);
                        std::__cxx11::string::string
                                  ((string *)(subLine.field_2._M_local_buf + 8),(string *)pbVar20);
                        std::
                        deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::pop_front(pdVar4);
                        std::
                        deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::pop_front(pdVar4);
                        std::__cxx11::string::string
                                  ((string *)local_60,"line number in code point",
                                   (allocator *)
                                   &scripts.
                                    super__Vector_base<chatra::Script,_std::allocator<chatra::Script>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
                        uVar33 = consume<unsigned_int,_nullptr>((string *)local_60,pdVar4);
                        std::__cxx11::string::~string((string *)local_60);
                        std::
                        deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::pop_front(pdVar4);
                        (*(debugger.
                           super___shared_ptr<chatra::debugger::IDebugger,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr)->_vptr_IDebugger[10])
                                  (&scripts.
                                    super__Vector_base<chatra::Script,_std::allocator<chatra::Script>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
                        pPVar34 = (pointer)scripts.
                                           super__Vector_base<chatra::Script,_std::allocator<chatra::Script>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
                        if ((pointer)scripts.
                                     super__Vector_base<chatra::Script,_std::allocator<chatra::Script>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage ==
                            packages.
                            super__Vector_base<chatra::debugger::PackageState,_std::allocator<chatra::debugger::PackageState>_>
                            ._M_impl.super__Vector_impl_data._M_start) {
                          pIVar18 = (IllegalArgumentException *)__cxa_allocate_exception(0x28);
                          chatra::IllegalArgumentException::IllegalArgumentException
                                    (pIVar18,"no packages",local_90);
                          __cxa_throw(pIVar18,&chatra::IllegalArgumentException::typeinfo,
                                      chatra::NativeException::~NativeException);
                        }
                        for (; pPVar34 !=
                               packages.
                               super__Vector_base<chatra::debugger::PackageState,_std::allocator<chatra::debugger::PackageState>_>
                               ._M_impl.super__Vector_impl_data._M_start; pPVar34 = pPVar34 + 1) {
                          sortScripts(&pPVar34->scripts);
                        }
                        local_1d0 = (undefined1  [8])0x0;
                        local_60 = (undefined1  [8])local_31;
                        vName._M_dataplus._M_p = local_90;
                        vName._M_string_length = (size_type)local_1d0;
                        vName.field_2._8_8_ =
                             packages.
                             super__Vector_base<chatra::debugger::PackageState,_std::allocator<chatra::debugger::PackageState>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                        lVar24 = (long)packages.
                                       super__Vector_base<chatra::debugger::PackageState,_std::allocator<chatra::debugger::PackageState>_>
                                       ._M_impl.super__Vector_impl_data._M_start -
                                 (long)scripts.
                                       super__Vector_base<chatra::Script,_std::allocator<chatra::Script>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
                        _Var35._M_current =
                             (PackageState *)
                             scripts.
                             super__Vector_base<chatra::Script,_std::allocator<chatra::Script>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage;
                        vName.field_2._M_allocated_capacity =
                             (size_type)(string *)(subLine.field_2._M_local_buf + 8);
                        for (lVar27 = lVar24 >> 8; 0 < lVar27; lVar27 = lVar27 + -1) {
                          bVar36 = __gnu_cxx::__ops::
                                   _Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_0>
                                   ::operator()((_Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__0>
                                                 *)local_60,_Var35);
                          uVar16 = _Var35._M_current;
                          if (bVar36) goto LAB_0011242a;
                          bVar36 = __gnu_cxx::__ops::
                                   _Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_0>
                                   ::operator()((_Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__0>
                                                 *)local_60,_Var35._M_current + 1);
                          uVar16 = _Var35._M_current + 1;
                          if (bVar36) goto LAB_0011242a;
                          bVar36 = __gnu_cxx::__ops::
                                   _Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_0>
                                   ::operator()((_Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__0>
                                                 *)local_60,_Var35._M_current + 2);
                          uVar16 = _Var35._M_current + 2;
                          if (bVar36) goto LAB_0011242a;
                          bVar36 = __gnu_cxx::__ops::
                                   _Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_0>
                                   ::operator()((_Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__0>
                                                 *)local_60,_Var35._M_current + 3);
                          uVar16 = _Var35._M_current + 3;
                          if (bVar36) goto LAB_0011242a;
                          _Var35._M_current = _Var35._M_current + 4;
                          lVar24 = lVar24 + -0x100;
                        }
                        lVar24 = lVar24 >> 6;
                        if (lVar24 == 1) {
LAB_00112a0b:
                          bVar36 = __gnu_cxx::__ops::
                                   _Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_0>
                                   ::operator()((_Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__0>
                                                 *)local_60,_Var35);
                          uVar16 = vName.field_2._8_8_;
                          if (bVar36) {
                            uVar16 = _Var35._M_current;
                          }
                        }
                        else if (lVar24 == 2) {
LAB_0011240a:
                          bVar36 = __gnu_cxx::__ops::
                                   _Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_0>
                                   ::operator()((_Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__0>
                                                 *)local_60,_Var35);
                          uVar16 = _Var35._M_current;
                          if (!bVar36) {
                            _Var35._M_current = _Var35._M_current + 1;
                            goto LAB_00112a0b;
                          }
                        }
                        else {
                          uVar16 = vName.field_2._8_8_;
                          if ((lVar24 == 3) &&
                             (bVar36 = __gnu_cxx::__ops::
                                       _Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_0>
                                       ::operator()((
                                                  _Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__0>
                                                  *)local_60,_Var35), uVar16 = _Var35._M_current,
                             !bVar36)) {
                            _Var35._M_current = _Var35._M_current + 1;
                            goto LAB_0011240a;
                          }
                        }
LAB_0011242a:
                        if ((pointer)uVar16 ==
                            packages.
                            super__Vector_base<chatra::debugger::PackageState,_std::allocator<chatra::debugger::PackageState>_>
                            ._M_impl.super__Vector_impl_data._M_start) {
                          vName.field_2._8_8_ =
                               packages.
                               super__Vector_base<chatra::debugger::PackageState,_std::allocator<chatra::debugger::PackageState>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                          local_60 = (undefined1  [8])local_31;
                          vName._M_dataplus._M_p = local_90;
                          vName._M_string_length = (size_type)local_1d0;
                          vName.field_2._M_allocated_capacity = (long)&subLine.field_2 + 8;
                          lVar24 = uVar16 - (long)scripts.
                                                  super__Vector_base<chatra::Script,_std::allocator<chatra::Script>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                          ;
                          _Var35._M_current =
                               (PackageState *)
                               scripts.
                               super__Vector_base<chatra::Script,_std::allocator<chatra::Script>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage;
                          for (lVar27 = lVar24 >> 8; uVar26 = vName.field_2._8_8_, 0 < lVar27;
                              lVar27 = lVar27 + -1) {
                            bVar36 = __gnu_cxx::__ops::
                                     _Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_1>
                                     ::operator()((
                                                  _Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__1>
                                                  *)local_60,_Var35);
                            uVar16 = _Var35._M_current;
                            if (bVar36) goto LAB_001124fd;
                            bVar36 = __gnu_cxx::__ops::
                                     _Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_1>
                                     ::operator()((
                                                  _Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__1>
                                                  *)local_60,_Var35._M_current + 1);
                            uVar16 = _Var35._M_current + 1;
                            if (bVar36) goto LAB_001124fd;
                            bVar36 = __gnu_cxx::__ops::
                                     _Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_1>
                                     ::operator()((
                                                  _Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__1>
                                                  *)local_60,_Var35._M_current + 2);
                            uVar16 = _Var35._M_current + 2;
                            if (bVar36) goto LAB_001124fd;
                            bVar36 = __gnu_cxx::__ops::
                                     _Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_1>
                                     ::operator()((
                                                  _Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__1>
                                                  *)local_60,_Var35._M_current + 3);
                            uVar16 = _Var35._M_current + 3;
                            if (bVar36) goto LAB_001124fd;
                            _Var35._M_current = _Var35._M_current + 4;
                            lVar24 = lVar24 + -0x100;
                          }
                          lVar24 = lVar24 >> 6;
                          if (lVar24 != 1) {
                            if (lVar24 != 2) {
                              uVar16 = uVar26;
                              if ((lVar24 != 3) ||
                                 (bVar36 = __gnu_cxx::__ops::
                                           _Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_1>
                                           ::operator()((
                                                  _Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__1>
                                                  *)local_60,_Var35), uVar16 = _Var35._M_current,
                                 bVar36)) goto LAB_001124fd;
                              _Var35._M_current = _Var35._M_current + 1;
                            }
                            bVar36 = __gnu_cxx::__ops::
                                     _Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_1>
                                     ::operator()((
                                                  _Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__1>
                                                  *)local_60,_Var35);
                            uVar16 = _Var35._M_current;
                            if (bVar36) goto LAB_001124fd;
                            _Var35._M_current = _Var35._M_current + 1;
                          }
                          bVar36 = __gnu_cxx::__ops::
                                   _Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_1>
                                   ::operator()((_Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__1>
                                                 *)local_60,_Var35);
                          uVar16 = uVar26;
                          if (bVar36) {
                            uVar16 = _Var35._M_current;
                          }
                        }
LAB_001124fd:
                        if (((pointer)uVar16 ==
                             packages.
                             super__Vector_base<chatra::debugger::PackageState,_std::allocator<chatra::debugger::PackageState>_>
                             ._M_impl.super__Vector_impl_data._M_start) && ((local_31[0] & 1) != 0))
                        {
                          vScript.field_2._12_4_ =
                               std::__cxx11::stoi((string *)((long)&subLine.field_2 + 8),
                                                  (size_t *)0x0,10);
                          if (vScript.field_2._12_4_ != -1) {
                            vName.field_2._8_8_ =
                                 packages.
                                 super__Vector_base<chatra::debugger::PackageState,_std::allocator<chatra::debugger::PackageState>_>
                                 ._M_impl.super__Vector_impl_data._M_start;
                            lVar24 = (long)packages.
                                           super__Vector_base<chatra::debugger::PackageState,_std::allocator<chatra::debugger::PackageState>_>
                                           ._M_impl.super__Vector_impl_data._M_start -
                                     (long)scripts.
                                           super__Vector_base<chatra::Script,_std::allocator<chatra::Script>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
                            _Var35._M_current =
                                 (PackageState *)
                                 scripts.
                                 super__Vector_base<chatra::Script,_std::allocator<chatra::Script>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
                            local_60 = (undefined1  [8])local_90;
                            vName._M_dataplus._M_p = (pointer)((long)&vScript.field_2 + 0xc);
                            vName._M_string_length = (size_type)local_1d0;
                            for (lVar27 = lVar24 >> 8; 0 < lVar27; lVar27 = lVar27 + -1) {
                              bVar36 = __gnu_cxx::__ops::
                                       _Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_2>
                                       ::operator()((
                                                  _Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__2>
                                                  *)local_60,_Var35);
                              uVar16 = _Var35._M_current;
                              if (bVar36) goto LAB_001125ec;
                              bVar36 = __gnu_cxx::__ops::
                                       _Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_2>
                                       ::operator()((
                                                  _Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__2>
                                                  *)local_60,_Var35._M_current + 1);
                              uVar16 = _Var35._M_current + 1;
                              if (bVar36) goto LAB_001125ec;
                              bVar36 = __gnu_cxx::__ops::
                                       _Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_2>
                                       ::operator()((
                                                  _Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__2>
                                                  *)local_60,_Var35._M_current + 2);
                              uVar16 = _Var35._M_current + 2;
                              if (bVar36) goto LAB_001125ec;
                              bVar36 = __gnu_cxx::__ops::
                                       _Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_2>
                                       ::operator()((
                                                  _Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__2>
                                                  *)local_60,_Var35._M_current + 3);
                              uVar16 = _Var35._M_current + 3;
                              if (bVar36) goto LAB_001125ec;
                              _Var35._M_current = _Var35._M_current + 4;
                              lVar24 = lVar24 + -0x100;
                            }
                            lVar24 = lVar24 >> 6;
                            uVar26 = vName.field_2._8_8_;
                            if (lVar24 != 1) {
                              if (lVar24 != 2) {
                                uVar16 = vName.field_2._8_8_;
                                if ((lVar24 != 3) ||
                                   (bVar36 = __gnu_cxx::__ops::
                                             _Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_2>
                                             ::operator()((
                                                  _Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__2>
                                                  *)local_60,_Var35), uVar16 = _Var35._M_current,
                                   bVar36)) goto LAB_001125ec;
                                _Var35._M_current = _Var35._M_current + 1;
                              }
                              uVar26 = vName.field_2._8_8_;
                              bVar36 = __gnu_cxx::__ops::
                                       _Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_2>
                                       ::operator()((
                                                  _Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__2>
                                                  *)local_60,_Var35);
                              uVar16 = _Var35._M_current;
                              if (bVar36) goto LAB_001125ec;
                              _Var35._M_current = _Var35._M_current + 1;
                            }
                            bVar36 = __gnu_cxx::__ops::
                                     _Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_2>
                                     ::operator()((
                                                  _Iter_pred<parseCodePoint(std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__2>
                                                  *)local_60,_Var35);
                            uVar16 = uVar26;
                            if (bVar36) {
                              uVar16 = _Var35._M_current;
                            }
                          }
                        }
LAB_001125ec:
                        if ((pointer)uVar16 ==
                            packages.
                            super__Vector_base<chatra::debugger::PackageState,_std::allocator<chatra::debugger::PackageState>_>
                            ._M_impl.super__Vector_impl_data._M_start) {
                          pIVar18 = (IllegalArgumentException *)__cxa_allocate_exception(0x28);
                          chatra::IllegalArgumentException::IllegalArgumentException
                                    (pIVar18,"file \"%s:%s\" is not found",local_90,
                                     subLine.field_2._8_8_);
                          __cxa_throw(pIVar18,&chatra::IllegalArgumentException::typeinfo,
                                      chatra::NativeException::~NativeException);
                        }
                        args.
                        super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_node =
                             (_Map_pointer)&verb._M_string_length;
                        verb._M_dataplus._M_p = (pointer)0x0;
                        verb._M_string_length._0_1_ = 0;
                        verb.field_2._8_8_ = &local_b8;
                        local_b8._M_local_buf[0] = '\0';
                        std::__cxx11::string::_M_assign
                                  ((string *)
                                   &args.
                                    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Deque_impl_data._M_finish._M_node);
                        std::__cxx11::string::_M_assign((string *)(verb.field_2._M_local_buf + 8));
                        local_a8 = uVar33;
                        std::
                        vector<chatra::debugger::PackageState,_std::allocator<chatra::debugger::PackageState>_>
                        ::~vector((vector<chatra::debugger::PackageState,_std::allocator<chatra::debugger::PackageState>_>
                                   *)&scripts.
                                      super__Vector_base<chatra::Script,_std::allocator<chatra::Script>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
                        std::__cxx11::string::~string((string *)(subLine.field_2._M_local_buf + 8));
                        std::__cxx11::string::~string((string *)local_90);
                        iVar11 = (*(debugger.
                                    super___shared_ptr<chatra::debugger::IDebugger,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->_vptr_IDebugger[8])
                                           (debugger.
                                            super___shared_ptr<chatra::debugger::IDebugger,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_ptr,&args.
                                                  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Deque_impl_data._M_finish._M_node)
                        ;
                        chatra::SpinLock::lock(&lockBreak);
                        std::vector<BreakPointState,_std::allocator<BreakPointState>_>::
                        emplace_back<>(&breakPoints);
                        pBVar7 = breakPoints.
                                 super__Vector_base<BreakPointState,_std::allocator<BreakPointState>_>
                                 ._M_impl.super__Vector_impl_data._M_finish;
                        breakPoints.
                        super__Vector_base<BreakPointState,_std::allocator<BreakPointState>_>.
                        _M_impl.super__Vector_impl_data._M_finish[-1].breakPointId =
                             CONCAT44(extraout_var_02,iVar11);
                        pppbVar2 = &args.
                                    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Deque_impl_data._M_finish._M_node;
                        chatra::debugger::CodePoint::operator=
                                  (&pBVar7[-1].codePoint,(CodePoint *)pppbVar2);
                        lockBreak.flag.super___atomic_flag_base._M_i =
                             (atomic_flag)(__atomic_flag_base)0x0;
                        chatra::debugger::CodePoint::~CodePoint((CodePoint *)pppbVar2);
                      }
                      else {
                        bVar36 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_2e8,"del");
                        if (!bVar36) {
                          bVar36 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_2e8,"step");
                          if (bVar36) {
                            std::__cxx11::string::string
                                      ((string *)local_60,"step",(allocator *)local_90);
                            consume<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&args.
                                           super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Deque_impl_data._M_finish._M_node,
                                       (string *)local_60,
                                       (deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)((long)&fileName.field_2 + 8));
                            std::__cxx11::string::~string((string *)local_60);
                            std::__cxx11::string::string
                                      ((string *)local_60,"step",(allocator *)local_90);
                            TVar21 = consumeTargetId<chatra::debugger::ThreadId,(Target)2>
                                               ((string *)local_60,fileName.field_2._M_local_buf + 8
                                                ,args_00);
                            std::__cxx11::string::~string((string *)local_60);
                            LOCK();
                            interruptionState._M_i = Acceptable;
                            UNLOCK();
                            pppbVar2 = &args.
                                        super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Deque_impl_data._M_finish._M_node;
                            bVar36 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)pppbVar2,"in");
                            lVar24 = 0x30;
                            if (!bVar36) {
                              bVar36 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)pppbVar2,"into");
                              lVar24 = 0x30;
                              if (!bVar36) {
                                bVar36 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)pppbVar2,"over");
                                lVar24 = 0x28;
                                if (!bVar36) {
                                  bVar36 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)pppbVar2,"out");
                                  lVar24 = 0x38;
                                  if (!bVar36) {
                                    pIVar18 = (IllegalArgumentException *)
                                              __cxa_allocate_exception(0x28);
                                    chatra::IllegalArgumentException::IllegalArgumentException
                                              (pIVar18,"unknown command: \"step %s\"",
                                               args.
                                               super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Deque_impl_data._M_finish._M_node);
                                    __cxa_throw(pIVar18,&chatra::IllegalArgumentException::typeinfo,
                                                chatra::NativeException::~NativeException);
                                  }
                                }
                              }
                            }
                            SVar13 = (**(code **)((long)(debugger.
                                                  super___shared_ptr<chatra::debugger::IDebugger,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->_vptr_IDebugger + lVar24))
                                               (debugger.
                                                super___shared_ptr<chatra::debugger::IDebugger,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_ptr,TVar21);
                            showStepRunResult(TVar21,SVar13);
                            LOCK();
                            interruptionState._M_i = Masked;
                            UNLOCK();
                            psVar31 = (string *)
                                      &args.
                                       super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Deque_impl_data._M_finish._M_node;
                            goto LAB_00111ff1;
                          }
                          bVar36 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_2e8,"i");
                          if (bVar36) {
                            pppbVar2 = &args.
                                        super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Deque_impl_data._M_finish._M_node;
                            std::__cxx11::string::string
                                      ((string *)pppbVar2,"step into",(allocator *)local_60);
                            TVar21 = consumeTargetId<chatra::debugger::ThreadId,(Target)2>
                                               ((string *)pppbVar2,fileName.field_2._M_local_buf + 8
                                                ,args_01);
                            std::__cxx11::string::~string((string *)pppbVar2);
                            LOCK();
                            interruptionState._M_i = Acceptable;
                            UNLOCK();
                            SVar13 = (*(debugger.
                                        super___shared_ptr<chatra::debugger::IDebugger,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->_vptr_IDebugger[6])
                                               (debugger.
                                                super___shared_ptr<chatra::debugger::IDebugger,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_ptr,TVar21);
                            showStepRunResult(TVar21,SVar13);
                          }
                          else {
                            bVar36 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_2e8,"o");
                            if (bVar36) {
                              pppbVar2 = &args.
                                          super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Deque_impl_data._M_finish._M_node;
                              std::__cxx11::string::string
                                        ((string *)pppbVar2,"step over",(allocator *)local_60);
                              TVar21 = consumeTargetId<chatra::debugger::ThreadId,(Target)2>
                                                 ((string *)pppbVar2,
                                                  fileName.field_2._M_local_buf + 8,args_02);
                              std::__cxx11::string::~string((string *)pppbVar2);
                              LOCK();
                              interruptionState._M_i = Acceptable;
                              UNLOCK();
                              SVar13 = (*(debugger.
                                          super___shared_ptr<chatra::debugger::IDebugger,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->_vptr_IDebugger[5])
                                                 (debugger.
                                                  super___shared_ptr<chatra::debugger::IDebugger,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr,TVar21);
                              showStepRunResult(TVar21,SVar13);
                            }
                            else {
                              bVar36 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_2e8,"r");
                              if (!bVar36) {
                                bVar36 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_2e8,"kill");
                                if (!bVar36) {
                                  std::
                                  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ::push_front((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                *)((long)&fileName.field_2 + 8),
                                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)local_2e8);
                                  std::
                                  _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ::_Deque_base((_Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 *)&args.
                                                  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Deque_impl_data._M_finish._M_node,
                                                (_Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 *)((long)&fileName.field_2 + 8));
                                  show((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)&args.
                                           super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Deque_impl_data._M_finish._M_node);
                                  goto LAB_001120ba;
                                }
                                pppbVar2 = &args.
                                            super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Deque_impl_data._M_finish._M_node;
                                std::__cxx11::string::string
                                          ((string *)pppbVar2,"kill",(allocator *)local_60);
                                TVar21 = consumeTargetId<chatra::debugger::ThreadId,(Target)2>
                                                   ((string *)pppbVar2,
                                                    fileName.field_2._M_local_buf + 8,args_04);
                                std::__cxx11::string::~string((string *)pppbVar2);
                                (*(debugger.
                                   super___shared_ptr<chatra::debugger::IDebugger,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr)->_vptr_IDebugger[0x10])
                                          (debugger.
                                           super___shared_ptr<chatra::debugger::IDebugger,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr,TVar21);
                                goto LAB_001120d4;
                              }
                              pppbVar2 = &args.
                                          super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Deque_impl_data._M_finish._M_node;
                              std::__cxx11::string::string
                                        ((string *)pppbVar2,"step out",(allocator *)local_60);
                              TVar21 = consumeTargetId<chatra::debugger::ThreadId,(Target)2>
                                                 ((string *)pppbVar2,
                                                  fileName.field_2._M_local_buf + 8,args_03);
                              std::__cxx11::string::~string((string *)pppbVar2);
                              LOCK();
                              interruptionState._M_i = Acceptable;
                              UNLOCK();
                              SVar13 = (*(debugger.
                                          super___shared_ptr<chatra::debugger::IDebugger,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->_vptr_IDebugger[7])
                                                 (debugger.
                                                  super___shared_ptr<chatra::debugger::IDebugger,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr,TVar21);
                              showStepRunResult(TVar21,SVar13);
                            }
                          }
                          goto LAB_0011201c;
                        }
                        pppbVar2 = &args.
                                    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Deque_impl_data._M_finish._M_node;
                        std::__cxx11::string::string((string *)pppbVar2,"del",(allocator *)local_60)
                        ;
                        consume<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                                  (&local_348,(string *)pppbVar2,
                                   (deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)((long)&fileName.field_2 + 8));
                        parseTargetId((string *)local_288);
                        std::__cxx11::string::~string((string *)&local_348);
                        auVar8 = local_288;
                        if ((int)e.super__Tuple_impl<0UL,_Target,_unsigned_long>.
                                 super__Tuple_impl<1UL,_unsigned_long>.
                                 super__Head_base<1UL,_unsigned_long,_false>._M_head_impl != 6) {
                          pIVar18 = (IllegalArgumentException *)__cxa_allocate_exception(0x28);
                          chatra::IllegalArgumentException::IllegalArgumentException
                                    (pIVar18,"required %s-ID","breakpoint");
                          __cxa_throw(pIVar18,&chatra::IllegalArgumentException::typeinfo,
                                      chatra::NativeException::~NativeException);
                        }
                        std::__cxx11::string::~string
                                  ((string *)
                                   &args.
                                    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Deque_impl_data._M_finish._M_node);
                        chatra::SpinLock::lock(&lockBreak);
                        lVar27 = (long)breakPoints.
                                       super__Vector_base<BreakPointState,_std::allocator<BreakPointState>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)breakPoints.
                                       super__Vector_base<BreakPointState,_std::allocator<BreakPointState>_>
                                       ._M_impl.super__Vector_impl_data._M_start;
                        lVar32 = lVar27 % 0x50;
                        __position._M_current =
                             breakPoints.
                             super__Vector_base<BreakPointState,_std::allocator<BreakPointState>_>.
                             _M_impl.super__Vector_impl_data._M_start;
                        for (lVar24 = lVar27 / 0x50 >> 2; 0 < lVar24; lVar24 = lVar24 + -1) {
                          if ((undefined1  [8])(__position._M_current)->breakPointId == auVar8)
                          goto LAB_00112bc4;
                          if ((undefined1  [8])__position._M_current[1].breakPointId == auVar8) {
                            __position._M_current = __position._M_current + 1;
                            goto LAB_00112bc4;
                          }
                          if ((undefined1  [8])__position._M_current[2].breakPointId == auVar8) {
                            __position._M_current = __position._M_current + 2;
                            goto LAB_00112bc4;
                          }
                          if ((undefined1  [8])__position._M_current[3].breakPointId == auVar8) {
                            __position._M_current = __position._M_current + 3;
                            goto LAB_00112bc4;
                          }
                          __position._M_current = __position._M_current + 4;
                          lVar27 = lVar27 + -0x140;
                        }
                        lVar24 = lVar27 / 0x50;
                        lVar32 = lVar27 % 0x50;
                        if (lVar24 == 1) {
LAB_00112ba4:
                          if ((undefined1  [8])(__position._M_current)->breakPointId != auVar8) {
                            __position._M_current =
                                 breakPoints.
                                 super__Vector_base<BreakPointState,_std::allocator<BreakPointState>_>
                                 ._M_impl.super__Vector_impl_data._M_finish;
                          }
                        }
                        else if (lVar24 == 2) {
LAB_00112b9a:
                          if ((undefined1  [8])(__position._M_current)->breakPointId != auVar8) {
                            __position._M_current = __position._M_current + 1;
                            goto LAB_00112ba4;
                          }
                        }
                        else {
                          if (lVar24 != 3) goto LAB_00112e00;
                          if ((undefined1  [8])(__position._M_current)->breakPointId != auVar8) {
                            __position._M_current = __position._M_current + 1;
                            goto LAB_00112b9a;
                          }
                        }
LAB_00112bc4:
                        if (__position._M_current ==
                            breakPoints.
                            super__Vector_base<BreakPointState,_std::allocator<BreakPointState>_>.
                            _M_impl.super__Vector_impl_data._M_finish) {
LAB_00112e00:
                          pIVar18 = (IllegalArgumentException *)
                                    __cxa_allocate_exception
                                              (0x28,breakPoints.
                                                                                                        
                                                  super__Vector_base<BreakPointState,_std::allocator<BreakPointState>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish,lVar32)
                          ;
                          chatra::IllegalArgumentException::IllegalArgumentException
                                    (pIVar18,"breakpoint B%zu is not found",auVar8);
                          __cxa_throw(pIVar18,&chatra::IllegalArgumentException::typeinfo,
                                      chatra::NativeException::~NativeException);
                        }
                        (*(debugger.
                           super___shared_ptr<chatra::debugger::IDebugger,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr)->_vptr_IDebugger[9])
                                  (debugger.
                                   super___shared_ptr<chatra::debugger::IDebugger,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr,auVar8);
                        std::vector<BreakPointState,_std::allocator<BreakPointState>_>::erase
                                  (&breakPoints,__position);
                        lockBreak.flag.super___atomic_flag_base._M_i =
                             (atomic_flag)(__atomic_flag_base)0x0;
                      }
                    }
                  }
                }
              }
LAB_001120d4:
              std::__cxx11::string::~string((string *)local_2e8);
              std::
              deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)((long)&fileName.field_2 + 8));
            }
            else {
              dError("syntax error (type \"!h\" to show help)");
            }
            std::
            vector<std::shared_ptr<chatra::Line>,_std::allocator<std::shared_ptr<chatra::Line>_>_>::
            ~vector((vector<std::shared_ptr<chatra::Line>,_std::allocator<std::shared_ptr<chatra::Line>_>_>
                     *)((long)&input.field_2 + 8));
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&sTable);
          }
          else {
            sVar17 = findToken((string *)(&lines.field_2._M_allocated_capacity + 1),0);
            if (sVar17 != 0) {
              pbVar29 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (&fileName.field_2._M_allocated_capacity + 1);
              std::__cxx11::string::substr
                        ((ulong)pbVar29,(ulong)(&lines.field_2._M_allocated_capacity + 1));
              bVar36 = std::operator==(pbVar29,"catch");
              if ((bVar36) || (bVar36 = std::operator==(pbVar29,"finally"), bVar36)) {
                dError("warning: %s block on top-level was ignored since it has no effect in interactive mode."
                       ,fileName.field_2._8_8_);
                std::__cxx11::string::~string((string *)(fileName.field_2._M_local_buf + 8));
                goto LAB_00111cec;
              }
              std::__cxx11::string::~string((string *)pbVar29);
            }
            uVar33 = (uint)local_98;
            std::__cxx11::to_string((string *)local_60,uVar33);
            pbVar29 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (fileName.field_2._M_local_buf + 8);
            std::operator+(pbVar29,"chatra[",(string *)local_60);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &args.
                            super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Deque_impl_data._M_finish._M_node,pbVar29,"]");
            std::__cxx11::string::~string((string *)pbVar29);
            std::__cxx11::string::~string((string *)local_60);
            peVar6 = host.super___shared_ptr<Host,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            std::__cxx11::string::string
                      ((string *)local_60,"",(allocator *)(subLine.field_2._M_local_buf + 8));
            std::__cxx11::string::string
                      ((string *)&local_2a8,
                       (string *)
                       &args.
                        super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_node);
            std::__cxx11::string::string
                      ((string *)&local_308,(string *)(lines.field_2._M_local_buf + 8));
            this = (Script *)((long)&fileName.field_2 + 8);
            chatra::Script::Script(this,&local_2a8,&local_308);
            __l._M_len = 1;
            __l._M_array = this;
            std::vector<chatra::Script,_std::allocator<chatra::Script>_>::vector
                      ((vector<chatra::Script,_std::allocator<chatra::Script>_> *)local_90,__l,
                       (allocator_type *)
                       &sTable.super___shared_ptr<chatra::StringTable,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
            Host::push(peVar6,(string *)local_60,
                       (vector<chatra::Script,_std::allocator<chatra::Script>_> *)local_90);
            std::vector<chatra::Script,_std::allocator<chatra::Script>_>::~vector
                      ((vector<chatra::Script,_std::allocator<chatra::Script>_> *)local_90);
            chatra::Script::~Script((Script *)((long)&fileName.field_2 + 8));
            std::__cxx11::string::~string((string *)&local_308);
            std::__cxx11::string::~string((string *)&local_2a8);
            std::__cxx11::string::~string((string *)local_60);
            pppbVar2 = &args.
                        super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_node;
            (*(runtime.super___shared_ptr<chatra::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              _vptr_Runtime[0xc])
                      (runtime.super___shared_ptr<chatra::Runtime,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,interactiveInstanceId,pppbVar2);
            std::__cxx11::string::~string((string *)pppbVar2);
            LOCK();
            interruptionState._M_i = Acceptable;
            UNLOCK();
            runUntilBreak();
            LOCK();
            interruptionState._M_i = Masked;
            UNLOCK();
            local_98 = (ulong)(uVar33 + 1);
          }
        }
      }
LAB_00111cec:
      std::__cxx11::string::~string((string *)(lines.field_2._M_local_buf + 8));
      bVar5 = false;
      bVar36 = false;
      uVar33 = 1;
    }
    else {
      pppbVar2 = &args.
                  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_node;
      std::__cxx11::string::substr((ulong)pppbVar2,(ulong)((long)&line.field_2 + 8));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (fileName.field_2._M_local_buf + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pppbVar2,
                     '\n');
      std::__cxx11::string::append((string *)&local_198);
      std::__cxx11::string::~string((string *)(fileName.field_2._M_local_buf + 8));
      std::__cxx11::string::~string
                ((string *)
                 &args.
                  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_node);
      bVar36 = true;
    }
LAB_00111d05:
    std::__cxx11::string::~string((string *)(line.field_2._M_local_buf + 8));
  } while( true );
}

Assistant:

[[noreturn]] static void interactiveMode() {
	std::signal(SIGINT, signalHandler);

	rl_bind_key('\t', rl_insert);
	stifle_history(1000);

	interactiveInstanceId = runtime->createInteractiveInstance();

	dLog(0, "Chatra interactive frontend");
	dLog(0, "type \"!h\" to show debugger command help");

	unsigned sectionNo = 0;
	unsigned lineNo = 1;
	std::string lines;
	std::string line;
	bool lineContinuation = false;
	bool blockContinuation = false;

	for (;;) {
		auto buffer = readline(prompt(blockContinuation, lineContinuation, sectionNo, lineNo));
		auto length = std::strlen(buffer);
		lineNo++;

		unsigned lineIndent = 0;
		for (size_t i = 0; i < length; i++) {
			if (buffer[i] == '\t')
				lineIndent++;
			else if (i + 3 < length && buffer[i] == ' ' && buffer[i + 1] == ' ' && buffer[i + 2] == ' ' && buffer[i + 3] == ' ') {
				lineIndent++;
				i += 3;
			}
		}

		auto subLine = std::string(buffer, length);

		if (lineContinuation) {
			for (unsigned i = 0; i < lineIndent + 2; i++)
				subLine.insert(subLine.cbegin(), '\t');
		}

		if (subLine.cend() != std::find_if(subLine.cbegin(), subLine.cend(), [](char c) {
				return cha::isNotSpace(c) && c != '\n';  })) {
			add_history(const_cast<char*>(subLine.data()));
		}

		if (subLine.empty() || subLine.back() != '\n')  // may be always true
			subLine += '\n';

		if (subLine.size() >= 2 && subLine[subLine.size() - 2] == '\\') {
			lineContinuation = true;
			line += subLine.substr(0, subLine.size() - 2) + '\n';
			continue;
		}
		else {
			lineContinuation = false;
			line += subLine;
		}

		// Remove line continuation marker when it comes from history and
		// contains wrapped line
		for (;;) {
			auto pos = line.find("\\\n");
			if (pos == std::string::npos)
				break;
			line.erase(pos, 1);
		}

		lines += line;
		if (blockContinuation) {
			if (line.size() <= 1)
				blockContinuation = false;
			else {
				line.clear();
				continue;
			}
		}
		else {
			auto it = std::find_if(line.cbegin(), line.cend(), cha::isNotSpace);
			if (isBlockStatement(std::string(it, line.cend()))) {
				blockContinuation = true;
				line.clear();
				continue;
			}
		}
		line.clear();
		auto input = lines.substr(std::distance(lines.cbegin(), std::find_if(lines.cbegin(), lines.cend(), cha::isNotSpace)));
		lines.clear();
		lineNo = 1;

		if (input.cend() == std::find_if(input.cbegin(), input.cend(), [](char c) {
				return cha::isNotSpace(c) && c != '\n';  })) {
			continue;
		}

		if (input[0] == '!') {
			processDebuggerCommand(input);
			continue;
		}

		auto t0Length = findToken(input);
		if (t0Length != 0) {
			auto firstToken = input.substr(0, t0Length);
			if (firstToken == "catch" || firstToken == "finally") {
				dError("warning: %s block on top-level was ignored since it has no effect in interactive mode.",
						firstToken.data());
				continue;
			}
		}

		try {
			auto scriptName = "chatra[" + std::to_string(sectionNo++) + "]";
			host->push("", {{scriptName, input}});
			runtime->push(interactiveInstanceId, scriptName, input);
		}
		catch (const cha::NativeException& ex) {
			dError("interactive mode: %s", ex.what() == nullptr ? "error" : ex.what());
			continue;
		}

		interruptible([&]() {
			runUntilBreak();
		});
	}
}